

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O2

MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3> * __thiscall
icu_63::MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3>::operator=
          (MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3> *this,
          MaybeStackArray<icu_63::numparse::impl::CodePointMatcher_*,_3> *src)

{
  CodePointMatcher **__src;
  int iVar1;
  
  releaseArray(this);
  iVar1 = src->capacity;
  this->capacity = iVar1;
  this->needToRelease = src->needToRelease;
  __src = src->stackArray;
  if (src->ptr == __src) {
    this->ptr = this->stackArray;
    memcpy(this->stackArray,__src,(long)iVar1 << 3);
  }
  else {
    this->ptr = src->ptr;
    src->ptr = __src;
    src->capacity = 3;
    src->needToRelease = '\0';
  }
  return this;
}

Assistant:

inline MaybeStackArray <T, stackCapacity>&
MaybeStackArray<T, stackCapacity>::operator=(MaybeStackArray <T, stackCapacity>&& src) U_NOEXCEPT {
    releaseArray();  // in case this instance had its own memory allocated
    capacity = src.capacity;
    needToRelease = src.needToRelease;
    if (src.ptr == src.stackArray) {
        ptr = stackArray;
        uprv_memcpy(stackArray, src.stackArray, sizeof(T) * src.capacity);
    } else {
        ptr = src.ptr;
        src.resetToStackArray();  // take ownership away from src
    }
    return *this;
}